

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic_metric.hpp
# Opt level: O0

pair<std::shared_ptr<ylt::metric::dynamic_metric_impl<std::atomic<long>,_(unsigned_char)__x02_>::metric_pair>,_bool>
* __thiscall
ylt::metric::dynamic_metric_impl<std::atomic<long>,(unsigned_char)2>::
try_emplace<std::array<std::__cxx11::string,2ul>const&>
          (dynamic_metric_impl<std::atomic<long>,_(unsigned_char)__x02_> *this,
          array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_2UL>
          *key)

{
  array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_2UL>
  *in_RDX;
  anon_class_1_0_00000001 *in_RSI;
  pair<std::shared_ptr<ylt::metric::dynamic_metric_impl<std::atomic<long>,_(unsigned_char)__x02_>::metric_pair>,_bool>
  *in_RDI;
  map_sharded_t<std::unordered_map<std::span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_2UL>,_ylt::metric::dynamic_metric_impl<std::atomic<long>,_(unsigned_char)__x02_>::value_type,_ylt::metric::dynamic_metric_impl<std::atomic<long>,_(unsigned_char)__x02_>::my_hash<131UL>,_ylt::metric::dynamic_metric_impl<std::atomic<long>,_(unsigned_char)__x02_>::my_equal,_std::allocator<std::pair<const_std::span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_2UL>,_ylt::metric::dynamic_metric_impl<std::atomic<long>,_(unsigned_char)__x02_>::value_type>_>_>,_ylt::metric::dynamic_metric_impl<std::atomic<long>,_(unsigned_char)__x02_>::my_hash<137UL>_>
  *unaff_retaddr;
  span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_2UL>
  view;
  array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_2UL>
  *in_stack_ffffffffffffffb8;
  pair<std::shared_ptr<ylt::metric::dynamic_metric_impl<std::atomic<long>,_(unsigned_char)__x02_>::metric_pair>,_bool>
  *key_00;
  
  key_00 = in_RDI;
  std::
  span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_2UL>::
  span<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_2UL>
            ((span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_2UL>
              *)in_RSI,in_stack_ffffffffffffffb8);
  util::
  map_sharded_t<std::unordered_map<std::span<std::__cxx11::string_const,2ul>,ylt::metric::dynamic_metric_impl<std::atomic<long>,(unsigned_char)2>::value_type,ylt::metric::dynamic_metric_impl<std::atomic<long>,(unsigned_char)2>::my_hash<131ul>,ylt::metric::dynamic_metric_impl<std::atomic<long>,(unsigned_char)2>::my_equal,std::allocator<std::pair<std::span<std::__cxx11::string_const,2ul>const,ylt::metric::dynamic_metric_impl<std::atomic<long>,(unsigned_char)2>::value_type>>>,ylt::metric::dynamic_metric_impl<std::atomic<long>,(unsigned_char)2>::my_hash<137ul>>
  ::
  try_emplace_with_op<ylt::metric::dynamic_metric_impl<std::atomic<long>,(unsigned_char)2>::try_emplace<std::array<std::__cxx11::string,2ul>const&>(std::array<std::__cxx11::string,2ul>const&)::_lambda(auto:1)_1_,std::array<std::__cxx11::string,2ul>const&>
            (unaff_retaddr,(key_type *)key_00,in_RSI,in_RDX);
  return in_RDI;
}

Assistant:

std::pair<std::shared_ptr<metric_pair>, bool> try_emplace(Key&& key,
                                                            Args&&... args) {
    std::span<const std::string, N> view = key;
    return map_.try_emplace_with_op(
        view,
        [](auto result) {
          if (result.second) {
            *const_cast<std::span<const std::string, N>*>(
                &result.first->first) = result.first->second->label;
          }
        },
        std::forward<Key>(key), std::forward<Args>(args)...);
  }